

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O3

int BiCG<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (TPZMatrix<float> *A,TPZFMatrix<float> *x,TPZFMatrix<float> *b,
              TPZMatrixSolver<float> *M,int64_t *max_iter,double *tol)

{
  double dVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  TPZFMatrix<float> rtilde;
  TPZFMatrix<float> ptilde;
  TPZFMatrix<float> p;
  TPZFMatrix<float> z;
  TPZFMatrix<float> r;
  TPZFMatrix<float> ztilde;
  TPZFMatrix<float> rho_1;
  TPZFMatrix<float> qtilde;
  TPZFMatrix<float> q;
  double local_7b0;
  TPZFMatrix<float> local_780;
  TPZFMatrix<float> local_6f0;
  TPZFMatrix<float> local_660;
  TPZFMatrix<float> local_5d0;
  TPZFMatrix<float> local_540;
  TPZFMatrix<float> local_4b0;
  TPZFMatrix<float> local_420;
  TPZFMatrix<float> local_390;
  TPZFMatrix<float> local_300;
  TPZFMatrix<float> local_270;
  TPZFMatrix<float> local_1e0;
  TPZFMatrix<float> local_150;
  TPZFMatrix<float> local_c0;
  
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_270.fElem = (float *)0x0;
  local_270.fGiven = (float *)0x0;
  local_270.fSize = 0;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_270.fWork.fStore = (float *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  local_270.fElem = (float *)operator_new__(4);
  local_300.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_300.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_300.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_300.fElem = (float *)0x0;
  local_300.fGiven = (float *)0x0;
  local_300.fSize = 0;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_300.fWork.fStore = (float *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  local_300.fElem = (float *)operator_new__(4);
  local_540.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_540.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_540.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_540.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_540.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_540.fElem = (float *)0x0;
  local_540.fGiven = (float *)0x0;
  local_540.fSize = 0;
  TPZVec<int>::TPZVec(&local_540.fPivot.super_TPZVec<int>,0);
  local_540.fPivot.super_TPZVec<int>.fStore = local_540.fPivot.fExtAlloc;
  local_540.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_540.fPivot.super_TPZVec<int>.fNElements = 0;
  local_540.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_540.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_540.fWork.fStore = (float *)0x0;
  local_540.fWork.fNElements = 0;
  local_540.fWork.fNAlloc = 0;
  local_540.fElem = (float *)operator_new__(4);
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_390.fElem = (float *)0x0;
  local_390.fGiven = (float *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_390.fWork.fStore = (float *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_390.fElem = (float *)operator_new__(4);
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_5d0.fElem = (float *)0x0;
  local_5d0.fGiven = (float *)0x0;
  local_5d0.fSize = 0;
  TPZVec<int>::TPZVec(&local_5d0.fPivot.super_TPZVec<int>,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_5d0.fWork.fStore = (float *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_420.fElem = (float *)0x0;
  local_420.fGiven = (float *)0x0;
  local_420.fSize = 0;
  TPZVec<int>::TPZVec(&local_420.fPivot.super_TPZVec<int>,0);
  local_420.fPivot.super_TPZVec<int>.fStore = local_420.fPivot.fExtAlloc;
  local_420.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_420.fPivot.super_TPZVec<int>.fNElements = 0;
  local_420.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_420.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_420.fWork.fStore = (float *)0x0;
  local_420.fWork.fNElements = 0;
  local_420.fWork.fNAlloc = 0;
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_660.fElem = (float *)0x0;
  local_660.fGiven = (float *)0x0;
  local_660.fSize = 0;
  TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
  local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
  local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_660.fPivot.super_TPZVec<int>.fNElements = 0;
  local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_660.fWork.fStore = (float *)0x0;
  local_660.fWork.fNElements = 0;
  local_660.fWork.fNAlloc = 0;
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_6f0.fElem = (float *)0x0;
  local_6f0.fGiven = (float *)0x0;
  local_6f0.fSize = 0;
  TPZVec<int>::TPZVec(&local_6f0.fPivot.super_TPZVec<int>,0);
  local_6f0.fPivot.super_TPZVec<int>.fStore = local_6f0.fPivot.fExtAlloc;
  local_6f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_6f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_6f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_6f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_6f0.fWork.fStore = (float *)0x0;
  local_6f0.fWork.fNElements = 0;
  local_6f0.fWork.fNAlloc = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_c0.fElem = (float *)0x0;
  local_c0.fGiven = (float *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_c0.fWork.fStore = (float *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_1e0.fElem = (float *)0x0;
  local_1e0.fGiven = (float *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_1e0.fWork.fStore = (float *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  fVar4 = Dot<float>(b,b);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  TPZMatrix<float>::operator*(&local_780,A,x);
  TPZFMatrix<float>::operator-(&local_4b0,b,&local_780);
  TPZFMatrix<float>::~TPZFMatrix(&local_780);
  TPZFMatrix<float>::TPZFMatrix(&local_780,&local_4b0);
  local_7b0 = (double)fVar4;
  if ((fVar4 == 0.0) && (!NAN(fVar4))) {
    local_7b0 = 1.0;
  }
  fVar4 = Dot<float>(&local_4b0,&local_4b0);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  uVar6 = (uint)(-(ulong)((double)fVar4 / local_7b0 <= *tol) >> 0x20) & 0x3ff00000;
  dVar1 = (double)((ulong)uVar6 << 0x20);
  if (*tol < (double)fVar4 / local_7b0) {
    if (0 < *max_iter) {
      lVar3 = 0;
      do {
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_4b0,&local_5d0,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_780,&local_420,0);
        fVar4 = Dot<float>(&local_5d0,&local_780);
        *local_270.fElem = fVar4;
        if ((fVar4 == 0.0) && (!NAN(fVar4))) {
          fVar4 = Dot<float>(&local_4b0,&local_4b0);
          if (fVar4 < 0.0) {
            fVar4 = sqrtf(fVar4);
          }
          else {
            fVar4 = SQRT(fVar4);
          }
          *tol = (double)fVar4 / local_7b0;
          *max_iter = lVar3 + 1;
          iVar2 = 2;
          goto LAB_00c6ddc1;
        }
        if (lVar3 == 0) {
          TPZFMatrix<float>::operator=(&local_660,&local_5d0);
          TPZFMatrix<float>::operator=(&local_6f0,&local_420);
        }
        else {
          fVar5 = *local_300.fElem;
          *local_390.fElem = fVar4 / fVar5;
          TPZFMatrix<float>::TimesBetaPlusZ(&local_660,fVar4 / fVar5,&local_5d0);
          TPZFMatrix<float>::TimesBetaPlusZ(&local_6f0,*local_390.fElem,&local_420);
        }
        TPZMatrix<float>::operator*(&local_150,A,&local_660);
        TPZFMatrix<float>::operator=(&local_c0,&local_150);
        TPZFMatrix<float>::~TPZFMatrix(&local_150);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_6f0,&local_1e0)
        ;
        fVar4 = *local_270.fElem;
        fVar5 = Dot<float>(&local_6f0,&local_c0);
        *local_540.fElem = fVar4 / fVar5;
        TPZFMatrix<float>::operator*(&local_150,&local_660,fVar4 / fVar5);
        TPZFMatrix<float>::operator+=(x,&local_150.super_TPZMatrix<float>);
        TPZFMatrix<float>::~TPZFMatrix(&local_150);
        TPZFMatrix<float>::operator*(&local_150,&local_c0,*local_540.fElem);
        TPZFMatrix<float>::operator-=(&local_4b0,&local_150.super_TPZMatrix<float>);
        TPZFMatrix<float>::~TPZFMatrix(&local_150);
        TPZFMatrix<float>::operator*(&local_150,&local_1e0,*local_540.fElem);
        TPZFMatrix<float>::operator-=(&local_780,&local_150.super_TPZMatrix<float>);
        TPZFMatrix<float>::~TPZFMatrix(&local_150);
        *local_300.fElem = *local_270.fElem;
        fVar4 = Dot<float>(&local_4b0,&local_4b0);
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        dVar1 = (double)fVar4 / local_7b0;
        if (dVar1 < *tol) {
          *tol = dVar1;
          *max_iter = lVar3 + 1;
          goto LAB_00c6daf7;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < *max_iter);
    }
    *tol = dVar1;
    iVar2 = 1;
  }
  else {
    *tol = (double)((ulong)uVar6 << 0x20);
    *max_iter = 0;
LAB_00c6daf7:
    iVar2 = 0;
  }
LAB_00c6ddc1:
  TPZFMatrix<float>::~TPZFMatrix(&local_780);
  TPZFMatrix<float>::~TPZFMatrix(&local_4b0);
  TPZFMatrix<float>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  TPZFMatrix<float>::~TPZFMatrix(&local_6f0);
  TPZFMatrix<float>::~TPZFMatrix(&local_660);
  TPZFMatrix<float>::~TPZFMatrix(&local_420);
  TPZFMatrix<float>::~TPZFMatrix(&local_5d0);
  TPZFMatrix<float>::~TPZFMatrix(&local_390);
  TPZFMatrix<float>::~TPZFMatrix(&local_540);
  TPZFMatrix<float>::~TPZFMatrix(&local_300);
  TPZFMatrix<float>::~TPZFMatrix(&local_270);
  return iVar2;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}